

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

void lgx_value_type_print(lgx_value_t *v)

{
  char *__format;
  lgx_str_t local_28;
  
  switch(v->type) {
  case T_UNKNOWN:
    __format = "unknown";
    break;
  default:
    return;
  case T_NULL:
    __format = "null";
    break;
  case T_LONG:
    __format = "int";
    break;
  case T_DOUBLE:
    __format = "float";
    break;
  case T_BOOL:
    __format = "bool";
    break;
  case T_STRING:
    __format = "string";
    break;
  case T_ARRAY:
  case T_FUNCTION:
    local_28.size = 0;
    local_28.length = 0;
    local_28.buffer = (char *)0x0;
    lgx_type_to_string(&((v->v).gc)->type,&local_28);
    printf("%.*s",(ulong)local_28._0_8_ >> 0x20,local_28.buffer);
    lgx_str_cleanup(&local_28);
    return;
  }
  printf(__format);
  return;
}

Assistant:

void lgx_value_type_print(lgx_value_t* v) {
    switch (v->type) {
        case T_UNKNOWN:
            printf("unknown");
            break;
        case T_LONG:
            printf("int");
            break;
        case T_DOUBLE:
            printf("float");
            break;
        case T_BOOL:
            printf("bool");
            break;
        case T_STRING:
            printf("string");
            break;
        case T_NULL:
            printf("null");
            break;
        case T_ARRAY:{
            lgx_str_t type;
            lgx_str_set_null(type);
            lgx_type_to_string(&v->v.arr->gc.type, &type);
            printf("%.*s", type.length, type.buffer);
            lgx_str_cleanup(&type);
            break;
        }
        case T_FUNCTION:{
            lgx_str_t type;
            lgx_str_set_null(type);
            lgx_type_to_string(&v->v.fun->gc.type, &type);
            printf("%.*s", type.length, type.buffer);
            lgx_str_cleanup(&type);
            break;
        }
        case T_CUSTOM:
        case T_MAP:
        case T_STRUCT:
        case T_INTERFACE:
            // TODO
            break;
        
    }
}